

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

void __thiscall position::set_piece(position *this,char *p,Square *s)

{
  difference_type local_60;
  Piece local_50;
  Color local_4c;
  Piece piece;
  Color color;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  char *local_38;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  difference_type local_28;
  difference_type idx;
  Square *s_local;
  char *p_local;
  position *this_local;
  
  idx = (difference_type)s;
  s_local = (Square *)p;
  p_local = (char *)this;
  local_30._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&SanPiece);
  local_40._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&SanPiece);
  _piece = std::vector<char,_std::allocator<char>_>::end(&SanPiece);
  local_38 = (char *)std::
                     find<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char>
                               (local_40,_piece,(char *)s_local);
  local_28 = std::
             distance<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                       (local_30,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                  )local_38);
  if (-1 < local_28) {
    local_4c = (Color)(5 < local_28);
    local_60 = local_28;
    if (5 < local_28) {
      local_60 = local_28 + -6;
    }
    local_50 = (Piece)local_60;
    piece_data::set(&this->pcs,&local_4c,&local_50,(Square *)idx,&this->ifo);
    if (local_50 == king) {
      (this->ifo).ks[local_4c] = *(Square *)idx;
    }
  }
  return;
}

Assistant:

void position::set_piece(const char& p, const Square& s) {
	auto idx = std::distance(SanPiece.begin(), std::find(SanPiece.begin(), SanPiece.end(), p));
	if (idx < 0) return; // error

	Color color = (idx < 6 ? white : black);
	Piece piece = Piece(idx < 6 ? idx : idx - 6);
	pcs.set(color, piece, s, ifo);
	if (piece == king) ifo.ks[color] = s;
}